

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::CostAttributes::getHessian
          (CostAttributes *this,VectorDynSize *values,MatrixDynSize *partialDerivative,string *label
          )

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  ostringstream errorTag;
  ostringstream errorMsg;
  char *local_358 [4];
  char *local_338 [4];
  ostringstream local_318 [376];
  ostringstream local_1a0 [376];
  
  uVar1 = iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)partialDerivative,uVar1);
  if (this->m_valid == false) {
    iDynTree::MatrixDynSize::zero();
  }
  else {
    lVar2 = iDynTree::VectorDynSize::size();
    (*((this->selector).
       super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_Selector[3])();
    lVar3 = iDynTree::MatrixDynSize::cols();
    if (lVar2 != lVar3) {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      std::__cxx11::ostringstream::ostringstream(local_318);
      poVar4 = std::operator<<((ostream *)local_318,"costSecondPartialDerivativeWRT");
      std::operator<<(poVar4,(string *)label);
      poVar4 = std::operator<<((ostream *)local_1a0,"The ");
      poVar4 = std::operator<<(poVar4,(string *)label);
      std::operator<<(poVar4," dimension is not the one expected from the specified selector.");
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("L2NormCost",local_338[0],local_358[0]);
      std::__cxx11::string::~string((string *)local_358);
      std::__cxx11::string::~string((string *)local_338);
      std::__cxx11::ostringstream::~ostringstream(local_318);
      std::__cxx11::ostringstream::~ostringstream(local_1a0);
      return false;
    }
    iDynTree::MatrixDynSize::operator=(partialDerivative,&this->hessianMatrix);
  }
  return true;
}

Assistant:

bool getHessian(const VectorDynSize& values, MatrixDynSize& partialDerivative, const std::string &label) {

                partialDerivative.resize(values.size(), values.size());

                if (!isValid()) {
                    partialDerivative.zero();
                    return true;
                }

                if (values.size() != selector->asSelectorMatrix().cols()) {
                    std::ostringstream errorMsg, errorTag;
                    errorTag << "costSecondPartialDerivativeWRT" << label;
                    errorMsg << "The " << label <<" dimension is not the one expected from the specified selector.";
                    reportError("L2NormCost", errorTag.str().c_str(), errorMsg.str().c_str());
                    return false;
                }

                partialDerivative = hessianMatrix;

                return true;

            }